

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_bases.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::SectionNode::SectionNode(SectionNode *this,SectionStats *_stats)

{
  SectionStats *_stats_local;
  SectionNode *this_local;
  
  SharedImpl<Catch::IShared>::SharedImpl(&this->super_SharedImpl<Catch::IShared>);
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__SectionNode_00252e80;
  SectionStats::SectionStats(&this->stats,_stats);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::vector(&this->childSections);
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            (&this->assertions);
  std::__cxx11::string::string((string *)&this->stdOut);
  std::__cxx11::string::string((string *)&this->stdErr);
  return;
}

Assistant:

explicit SectionNode( SectionStats const& _stats ) : stats( _stats ) {}